

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::InitializeObservations::operator()
          (InitializeObservations *this,iterator_t *str,iterator_t *end)

{
  undefined4 uVar1;
  POMDPDiscrete *pPVar2;
  MultiAgentDecisionProcessDiscrete *in_RDI;
  undefined1 in_stack_ffffffffffffffdf;
  
  GetPOMDPDiscrete(*(ParserPOMDPFormat_Spirit **)&in_RDI->super_MultiAgentDecisionProcess);
  MultiAgentDecisionProcessDiscrete::ConstructJointObservations
            ((MultiAgentDecisionProcessDiscrete *)0xa68ffd);
  GetPOMDPDiscrete(*(ParserPOMDPFormat_Spirit **)&in_RDI->super_MultiAgentDecisionProcess);
  MultiAgentDecisionProcessDiscrete::SetObservationsInitialized
            (in_RDI,(bool)in_stack_ffffffffffffffdf);
  pPVar2 = GetPOMDPDiscrete(*(ParserPOMDPFormat_Spirit **)&in_RDI->super_MultiAgentDecisionProcess);
  uVar1 = (**(code **)(*(long *)&(pPVar2->super_DecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscrete.
                                 super_MultiAgentDecisionProcess + 0xd0))();
  *(undefined4 *)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x58) = uVar1;
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                _m_po->GetPOMDPDiscrete()->ConstructJointObservations();
                _m_po->GetPOMDPDiscrete()->SetObservationsInitialized(true);
                _m_po->_m_anyJOIndex = _m_po->GetPOMDPDiscrete()->
                    GetNrJointObservations();
            }